

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_linkUnitsViaUnitsObject_Test::~Units_linkUnitsViaUnitsObject_Test
          (Units_linkUnitsViaUnitsObject_Test *this)

{
  Units_linkUnitsViaUnitsObject_Test *this_local;
  
  ~Units_linkUnitsViaUnitsObject_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, linkUnitsViaUnitsObject)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();

    u1->setName("a_unit");
    u2->setName("a_unit");

    v1->setUnits(u1);

    c1->addVariable(v1);
    m->addComponent(c1);
    m->addUnits(u2);

    m->linkUnits();
    EXPECT_FALSE(m->hasUnlinkedUnits());
}